

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic.c
# Opt level: O0

int picnic_write_public_key(picnic_publickey_t *key,uint8_t *buf,size_t buflen)

{
  picnic_instance_t *ppVar1;
  ulong in_RDX;
  void *in_RSI;
  byte *in_RDI;
  size_t bytes_required;
  picnic_instance_t *instance;
  picnic_params_t param;
  int local_4;
  
  if ((in_RDI == (byte *)0x0) || (in_RSI == (void *)0x0)) {
    local_4 = -1;
  }
  else {
    ppVar1 = picnic_instance_get((uint)*in_RDI);
    if (ppVar1 == (picnic_instance_t *)0x0) {
      local_4 = -1;
    }
    else {
      local_4 = (uint)ppVar1->input_output_size * 2 + 1;
      if (in_RDX < (ulong)(long)local_4) {
        local_4 = -1;
      }
      else {
        memcpy(in_RSI,in_RDI,(long)local_4);
      }
    }
  }
  return local_4;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_write_public_key(const picnic_publickey_t* key, uint8_t* buf,
                                                      size_t buflen) {
  if (!key || !buf) {
    return -1;
  }

  const picnic_params_t param       = key->data[0];
  const picnic_instance_t* instance = picnic_instance_get(param);
  if (!instance) {
    return -1;
  }

  const size_t bytes_required = 1 + 2 * instance->input_output_size;
  if (buflen < bytes_required) {
    return -1;
  }

  memcpy(buf, key->data, bytes_required);
  return (int)bytes_required;
}